

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageTests.cpp
# Opt level: O1

string * __thiscall
vkt::pipeline::(anonymous_namespace)::ImageTest::getGlslSampler_abi_cxx11_
          (string *__return_storage_ptr__,ImageTest *this,TextureFormat *format,VkImageViewType type
          ,VkDescriptorType samplingType,int imageCount)

{
  long *plVar1;
  VkImageViewType type_00;
  long *plVar2;
  size_type *psVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  string texSampler;
  string texImage;
  char *local_d0;
  size_type local_c8;
  char local_c0;
  undefined7 uStack_bf;
  undefined8 uStack_b8;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  pcVar4 = "texSampler";
  if (1 < (int)samplingType) {
    pcVar4 = "texSamplers[i]";
  }
  local_d0 = &local_c0;
  pcVar5 = "texImage";
  if (1 < (int)samplingType) {
    pcVar5 = "texImages[i]";
  }
  lVar6 = (ulong)(1 < (int)samplingType) * 4;
  type_00 = type;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,pcVar4,pcVar4 + lVar6 + 10);
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,pcVar5,pcVar5 + lVar6 + 8);
  if (type == VK_IMAGE_VIEW_TYPE_3D) {
    getGlslSamplerType_abi_cxx11_
              (&local_50,this,(TextureFormat *)((ulong)format & 0xffffffff),type_00);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_80 = *plVar2;
      lStack_78 = plVar1[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar2;
      local_90 = (long *)*plVar1;
    }
    local_88 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0[0]);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_60 = *plVar2;
      lStack_58 = plVar1[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar2;
      local_70 = (long *)*plVar1;
    }
    local_68 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar3 = (size_type *)(plVar1 + 2);
    if ((size_type *)*plVar1 == psVar3) {
      lVar6 = plVar1[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar6;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    }
    __return_storage_ptr__->_M_string_length = plVar1[1];
    *plVar1 = (long)psVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_d0 == &local_c0) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_bf,local_c0);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_b8;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_d0;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_bf,local_c0);
    }
    __return_storage_ptr__->_M_string_length = local_c8;
    local_c8 = 0;
    local_c0 = '\0';
    local_d0 = &local_c0;
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ImageTest::getGlslSampler (const tcu::TextureFormat& format, VkImageViewType type, VkDescriptorType samplingType, int imageCount)
{
	std::string texSampler	= imageCount > 1 ? "texSamplers[i]" : "texSampler";
	std::string texImage	= imageCount > 1 ? "texImages[i]" : "texImage";

	switch (samplingType)
	{
		case VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
			return getGlslSamplerType(format, type) + "(" + texImage + ", texSampler)";
		case VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER:
		default:
			return texSampler;
	}
}